

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O2

void __thiscall Kernel::InferenceStore::TPTPProofPrinter::printStep(TPTPProofPrinter *this,Unit *us)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  InferenceRule rule;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  Formula *pFVar4;
  ostream *poVar5;
  string *this_00;
  string newSymbOrigin;
  string statusStr;
  string local_1e8;
  UnitIterator parents;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string inferenceStr;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string formulaStr;
  
  rule = (us->_inference).field_0x1;
  Unit::getParents((Unit *)&parents);
  if (rule == GENERAL_SPLITTING) {
    printSplitting(this,us);
    goto LAB_0042f829;
  }
  if (rule == GENERAL_SPLITTING_COMPONENT) {
    printGeneralSplittingComponent(this,us);
    goto LAB_0042f829;
  }
  getFormulaString_abi_cxx11_(&formulaStr,this,us);
  inferenceStr._M_dataplus._M_p = (pointer)&inferenceStr.field_2;
  inferenceStr._M_string_length = 0;
  inferenceStr.field_2._M_local_buf[0] = '\0';
  paVar1 = &statusStr.field_2;
  statusStr._M_dataplus._M_p = (pointer)paVar1;
  if (rule == INPUT) {
    statusStr._M_string_length = 0;
    statusStr.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)&newSymbOrigin,(string *)(Lib::env + 0xdf50));
    bVar2 = std::operator==(&newSymbOrigin,"");
    std::__cxx11::string::~string((string *)&newSymbOrigin);
    if (bVar2) {
      std::__cxx11::string::assign((char *)&statusStr);
    }
    else {
      std::__cxx11::string::string((string *)&local_1c0,(string *)(Lib::env + 0xdf50));
      std::operator+(&local_1e8,"\'",&local_1c0);
      std::operator+(&newSymbOrigin,&local_1e8,"\'");
      std::__cxx11::string::operator=((string *)&statusStr,(string *)&newSymbOrigin);
      std::__cxx11::string::~string((string *)&newSymbOrigin);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1c0);
    }
    newSymbOrigin._M_dataplus._M_p = (pointer)&newSymbOrigin.field_2;
    newSymbOrigin._M_string_length = 0;
    newSymbOrigin.field_2._M_local_buf[0] = '\0';
    if (((this->super_ProofPrinter).outputAxiomNames != true) ||
       (bVar2 = Parse::TPTP::findAxiomName(us,&newSymbOrigin), !bVar2)) {
      if ((us->field_0x4 & 1) != 0) {
        pFVar4 = Unit::getFormula(us);
        bVar2 = Formula::hasLabel(pFVar4);
        if (bVar2) {
          pFVar4 = Unit::getFormula(us);
          std::__cxx11::string::string((string *)&local_1e8,(string *)&pFVar4->_label);
          std::__cxx11::string::operator=((string *)&newSymbOrigin,(string *)&local_1e8);
          std::__cxx11::string::~string((string *)&local_1e8);
          goto LAB_0042f64f;
        }
      }
      std::__cxx11::string::assign((char *)&newSymbOrigin);
    }
LAB_0042f64f:
    std::operator+(&local_170,"file(",&statusStr);
    std::operator+(&local_150,&local_170,",");
    std::__cxx11::string::string((string *)&local_90,(string *)&newSymbOrigin);
    quoteAxiomName(&local_70,this,&local_90);
    std::operator+(&local_1c0,&local_150,&local_70);
    std::operator+(&local_1e8,&local_1c0,")");
    std::__cxx11::string::operator=((string *)&inferenceStr,(string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    this_00 = &newSymbOrigin;
LAB_0042f73e:
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::string::~string((string *)&statusStr);
  }
  else {
    iVar3 = (*(parents._core)->_vptr_IteratorCore[2])();
    if ((char)iVar3 == '\0') {
      statusStr._M_string_length = 0;
      statusStr.field_2._M_local_buf[0] = '\0';
      bVar2 = hasNewSymbols(this,us);
      if (bVar2) {
        newSymbOrigin._M_dataplus._M_p = (pointer)&newSymbOrigin.field_2;
        newSymbOrigin._M_string_length = 0;
        newSymbOrigin.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::assign((char *)&newSymbOrigin);
        std::__cxx11::string::string((string *)&local_b0,(string *)&newSymbOrigin);
        getNewSymbols(&local_1e8,this,&local_b0,us);
        std::__cxx11::string::operator=((string *)&statusStr,(string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&newSymbOrigin);
      }
      tptpRuleName_abi_cxx11_(&local_170,this,rule);
      std::operator+(&local_150,"introduced(",&local_170);
      std::operator+(&local_1c0,&local_150,",[");
      std::operator+(&local_1e8,&local_1c0,&statusStr);
      std::operator+(&newSymbOrigin,&local_1e8,"])");
      std::__cxx11::string::operator=((string *)&inferenceStr,(string *)&newSymbOrigin);
      std::__cxx11::string::~string((string *)&newSymbOrigin);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_150);
      this_00 = &local_170;
      goto LAB_0042f73e;
    }
    statusStr._M_string_length = 0;
    statusStr.field_2._M_local_buf[0] = '\0';
    if (rule == SKOLEMIZE) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"skolem",(allocator<char> *)&local_1c0);
      getNewSymbols(&local_1e8,this,&local_d0,us);
      std::operator+(&newSymbOrigin,"status(esa),",&local_1e8);
      std::__cxx11::string::operator=((string *)&statusStr,(string *)&newSymbOrigin);
      std::__cxx11::string::~string((string *)&newSymbOrigin);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    tptpRuleName_abi_cxx11_(&local_1e8,this,rule);
    std::operator+(&newSymbOrigin,"inference(",&local_1e8);
    std::__cxx11::string::operator=((string *)&inferenceStr,(string *)&newSymbOrigin);
    std::__cxx11::string::~string((string *)&newSymbOrigin);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::operator+(&local_1e8,",[",&statusStr);
    std::operator+(&newSymbOrigin,&local_1e8,"],[");
    std::__cxx11::string::append((string *)&inferenceStr);
    std::__cxx11::string::~string((string *)&newSymbOrigin);
    std::__cxx11::string::~string((string *)&local_1e8);
    bVar2 = true;
    while (iVar3 = (*(parents._core)->_vptr_IteratorCore[2])(), (char)iVar3 != '\0') {
      iVar3 = (*(parents._core)->_vptr_IteratorCore[3])();
      if (!bVar2) {
        std::__cxx11::string::push_back((char)&inferenceStr);
      }
      tptpUnitId_abi_cxx11_(&newSymbOrigin,this,(Unit *)CONCAT44(extraout_var,iVar3));
      std::__cxx11::string::append((string *)&inferenceStr);
      std::__cxx11::string::~string((string *)&newSymbOrigin);
      bVar2 = false;
    }
    std::__cxx11::string::append((char *)&inferenceStr);
    std::__cxx11::string::~string((string *)&statusStr);
  }
  poVar5 = (this->super_ProofPrinter).out;
  tptpUnitId_abi_cxx11_(&local_f0,this,us);
  std::__cxx11::string::string((string *)&local_110,(string *)&formulaStr);
  std::__cxx11::string::string((string *)&local_130,(string *)&inferenceStr);
  getFofString(&statusStr,this,&local_f0,&local_110,&local_130,rule,
               *(byte *)&us->_inference >> 2 & (MODEL_DEFINITION|ASSUMPTION));
  poVar5 = std::operator<<(poVar5,(string *)&statusStr);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::string::~string((string *)&statusStr);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&inferenceStr);
  std::__cxx11::string::~string((string *)&formulaStr);
LAB_0042f829:
  Lib::VirtualIterator<Kernel::Unit_*>::~VirtualIterator(&parents);
  return;
}

Assistant:

void printStep(Unit* us)
  {
    InferenceRule rule = us->inference().rule();
    UnitIterator parents= us->getParents();

    switch(rule) {
    //case Inference::AVATAR_COMPONENT:
    //  printSplittingComponentIntroduction(us);
    //  return;
    case InferenceRule::GENERAL_SPLITTING_COMPONENT:
      printGeneralSplittingComponent(us);
      return;
    case InferenceRule::GENERAL_SPLITTING:
      printSplitting(us);
      return;
    default: ;
    }

    //get std::string representing the formula

    std::string formulaStr=getFormulaString(us);

    //get inference std::string

    std::string inferenceStr;
    if (rule==InferenceRule::INPUT) {
      std::string fileName;
      if (env.options->inputFile()=="") {
	      fileName="unknown";
      }
      else {
	      fileName="'"+env.options->inputFile()+"'";
      }
      std::string axiomName;
      if (!outputAxiomNames || !Parse::TPTP::findAxiomName(us, axiomName)) {
        // Giles' ucore extraction code parses labels from smtlib files, let's try printing these too
        if (!us->isClause() && us->getFormula()->hasLabel()) {
          axiomName = us->getFormula()->getLabel();
        } else {
	        axiomName="unknown";
        }
      }
      inferenceStr="file("+fileName+","+quoteAxiomName(axiomName)+")";
    }
    else if (!parents.hasNext()) {
      std::string newSymbolInfo;
      if (hasNewSymbols(us)) {
        std::string newSymbOrigin;
        if (rule == InferenceRule::FUNCTION_DEFINITION ||
          rule == InferenceRule::FOOL_ITE_DEFINITION || rule == InferenceRule::FOOL_LET_DEFINITION ||
          rule == InferenceRule::FOOL_FORMULA_DEFINITION || rule == InferenceRule::FOOL_MATCH_DEFINITION) {
          newSymbOrigin = "definition";
        } else {
          newSymbOrigin = "naming";
        }
	      newSymbolInfo = getNewSymbols(newSymbOrigin,us);
      }
      inferenceStr="introduced("+tptpRuleName(rule)+",["+newSymbolInfo+"])";
    }
    else {
      ASS(parents.hasNext());
      std::string statusStr;
      if (rule==InferenceRule::SKOLEMIZE) {
	      statusStr="status(esa),"+getNewSymbols("skolem",us);
      }

      inferenceStr="inference("+tptpRuleName(rule);

      inferenceStr+=",["+statusStr+"],[";
      bool first=true;
      while(parents.hasNext()) {
        Unit* prem=parents.next();
        if (!first) {
          inferenceStr+=',';
        }
        inferenceStr+=tptpUnitId(prem);
        first=false;
      }
      inferenceStr+="])";
    }

    out<<getFofString(tptpUnitId(us), formulaStr, inferenceStr, rule, us->inputType())<<endl;
  }